

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void freeobj(lua_State *L,GCObject *o)

{
  lu_byte lVar1;
  byte bVar2;
  GCObject *pGVar3;
  lu_byte *osize;
  ulong uVar4;
  
  lVar1 = o->tt;
  switch(lVar1) {
  case '\x04':
    luaS_remove(L,(TString *)o);
    if ((o->tt & 0xf) != 4) {
      __assert_fail("(((o)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,899,"void freeobj(lua_State *, GCObject *)");
    }
    pGVar3 = (GCObject *)(ulong)(byte)o->field_0xb;
    goto LAB_0012f5db;
  case '\x05':
    luaH_free(L,(Table *)o);
    return;
  case '\x06':
    bVar2 = o->field_0xa;
    if (bVar2 == 0) {
      osize = (lu_byte *)0x20;
    }
    else {
      uVar4 = 0;
      do {
        if ((UpVal *)(&o[2].next)[uVar4] != (UpVal *)0x0) {
          luaC_upvdeccount(L,(UpVal *)(&o[2].next)[uVar4]);
          bVar2 = o->field_0xa;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < bVar2);
      osize = (lu_byte *)((ulong)bVar2 * 8 + 0x20);
    }
    break;
  case '\a':
    osize = (lu_byte *)(*(long *)&o[1].tt + 0x28);
    break;
  case '\b':
    luaE_freethread(L,(lua_State *)o);
    return;
  case '\t':
    luaF_freeproto(L,(Proto *)o);
    return;
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
switchD_0012f518_caseD_a:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x389,"void freeobj(lua_State *, GCObject *)");
  case '\x14':
    pGVar3 = o[1].next;
LAB_0012f5db:
    osize = &pGVar3[1].marked;
    break;
  case '\x15':
switchD_0012f518_caseD_15:
    raviH_free(L,(RaviArray *)o);
    return;
  default:
    if (lVar1 == '%') goto switchD_0012f518_caseD_15;
    if (lVar1 != '&') goto switchD_0012f518_caseD_a;
    osize = (lu_byte *)((ulong)(byte)o->field_0xa * 0x10 + 0x20);
  }
  luaM_realloc_(L,o,(size_t)osize,0);
  return;
}

Assistant:

static void freeobj(lua_State *L, GCObject *o) {
  switch (o->tt) {
    case LUA_TPROTO:
      luaF_freeproto(L, gco2p(o));
      break;
    case LUA_TLCL:
      freeLclosure(L, gco2lcl(o));
      break;
    case LUA_TCCL:
      luaM_freemem(L, o, sizeCclosure(gco2ccl(o)->nupvalues));
      break;
    case LUA_TTABLE:
      luaH_free(L, gco2t(o));
      break;
    case LUA_TTHREAD:
      luaE_freethread(L, gco2th(o));
      break;
    case LUA_TUSERDATA:
      luaM_freemem(L, o, sizeudata(gco2u(o)));
      break;

    /* RAVI changes */
    case RAVI_TFARRAY:
    case RAVI_TIARRAY:
      raviH_free(L, gco2array(o));
      break;
    case LUA_TSHRSTR:
      luaS_remove(L, gco2ts(o)); /* remove it from hash table */
      luaM_freemem(L, o, sizelstring(gco2ts(o)->shrlen));
      break;
    case LUA_TLNGSTR:
      luaM_freemem(L, o, sizelstring(gco2ts(o)->u.lnglen));
      break;
    default:
      lua_assert(0);
  }
}